

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> * __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::operator=
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,
          SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *rhs)

{
  EVP_PKEY_CTX *ctx;
  pointer pEVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pEVar4;
  size_type sVar5;
  long lVar6;
  
  if (this == rhs) {
    return this;
  }
  ctx = (EVP_PKEY_CTX *)rhs->data_;
  if (ctx != (EVP_PKEY_CTX *)rhs->firstElement) {
    cleanup(this,ctx);
    pEVar1 = rhs->data_;
    rhs->data_ = (pointer)0x0;
    this->data_ = pEVar1;
    sVar5 = rhs->len;
    rhs->len = 0;
    this->len = sVar5;
    sVar5 = rhs->cap;
    rhs->cap = 0;
    this->cap = sVar5;
    return this;
  }
  uVar2 = this->len;
  uVar3 = rhs->len;
  if (uVar2 < uVar3) {
    if (this->cap < uVar3) {
      this->len = 0;
      reserve(this,rhs->len);
    }
    else if (uVar2 != 0) {
      memmove(this->data_,ctx,uVar2 << 3);
    }
    pEVar1 = rhs->data_;
    sVar5 = rhs->len;
    pEVar4 = this->data_;
    for (lVar6 = this->len << 3; sVar5 << 3 != lVar6; lVar6 = lVar6 + 8) {
      *(undefined8 *)((long)&pEVar4->value + lVar6) = *(undefined8 *)((long)&pEVar1->value + lVar6);
    }
  }
  else {
    if (uVar3 == 0) {
      sVar5 = 0;
      goto LAB_00395d5f;
    }
    memmove(this->data_,ctx,uVar3 << 3);
  }
  sVar5 = rhs->len;
LAB_00395d5f:
  this->len = sVar5;
  rhs->len = 0;
  return this;
}

Assistant:

SmallVectorBase<T>& SmallVectorBase<T>::operator=(SmallVectorBase<T>&& rhs) {
    if (this == &rhs)
        return *this;

    // If the rhs isn't small, clear this vector and then steal its buffer.
    if (!rhs.isSmall()) {
        cleanup();
        this->data_ = std::exchange(rhs.data_, nullptr);
        this->len = std::exchange(rhs.len, 0);
        this->cap = std::exchange(rhs.cap, 0);
        return *this;
    }

    // If we already have sufficient space assign the common elements,
    // then destroy any excess.
    if (len >= rhs.size()) {
        iterator newEnd;
        if (rhs.size())
            newEnd = std::ranges::move(rhs, begin()).out;
        else
            newEnd = begin();

        std::ranges::destroy(newEnd, end());
        len = rhs.size();
        rhs.clear();
        return *this;
    }

    if (capacity() < rhs.size()) {
        // If we have to grow to have enough elements, destroy the current elements.
        // This allows us to avoid copying them during the grow.
        clear();
        reserve(rhs.size());
    }
    else if (len) {
        // Otherwise, use assignment for the already-constructed elements.
        std::ranges::move(rhs.begin(), rhs.begin() + len, begin());
    }

    // Move construct the new elements in place.
    std::uninitialized_move(rhs.begin() + len, rhs.end(), begin() + len);
    len = rhs.size();
    rhs.clear();
    return *this;
}